

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,EBCellFlag *flag)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  int k;
  int iVar6;
  int j;
  int iVar7;
  fmtflags __old;
  
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1 & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar3 = std::operator<<(poVar3,":");
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::operator<<(os,&DAT_007180a4 + *(int *)(&DAT_007180a4 + (ulong)(flag->flag & 3) * 4));
  iVar2 = 5;
  for (iVar6 = -1; iVar6 != 2; iVar6 = iVar6 + 1) {
    iVar4 = iVar2;
    for (iVar7 = -1; iVar7 != 2; iVar7 = iVar7 + 1) {
      for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
        std::ostream::operator<<(os,(uint)((flag->flag >> (iVar5 + iVar4 & 0x1fU) & 1) != 0));
      }
      iVar4 = iVar4 + 3;
    }
    iVar2 = iVar2 + 9;
  }
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const EBCellFlag& flag)
{
    std::ios_base::fmtflags old_fmt = os.flags();
    os << std::hex << flag.getValue() << ":" << std::dec;

    if (flag.isRegular()) {
        os << "R";
    } else if (flag.isSingleValued()) {
        os << "S";
    } else if (flag.isCovered()) {
        os << "C";
    } else {
        os << "M";
    }

#if (AMREX_SPACEDIM == 3)
    for (int k = -1; k <= 1; ++k) {
#endif
        for (int j = -1; j <= 1; ++j) {
            for (int i = -1; i <= 1; ++i) {
                os << static_cast<int>(flag.isConnected(IntVect{AMREX_D_DECL(i,j,k)}));
            }
        }
#if (AMREX_SPACEDIM == 3)
    }
#endif

    os.flags(old_fmt);

    return os;
}